

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O3

ktx_error_code_e mapAstcError(astcenc_error astc_error)

{
  switch(astc_error) {
  case ASTCENC_SUCCESS:
    goto switchD_001fb7c6_caseD_0;
  case ASTCENC_ERR_OUT_OF_MEM:
    astc_error = ASTCENC_ERR_BAD_FLAGS|ASTCENC_ERR_BAD_PROFILE;
switchD_001fb7c6_caseD_0:
    return astc_error;
  case ASTCENC_ERR_BAD_CPU_FLOAT:
    __assert_fail("false && \"Code compiled such that float operations do not meet codec\'s assumptions.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x26a,"ktx_error_code_e mapAstcError(astcenc_error)");
  case ASTCENC_ERR_BAD_PARAM:
  case ASTCENC_ERR_BAD_BLOCK_SIZE:
  case ASTCENC_ERR_BAD_PROFILE:
  case ASTCENC_ERR_BAD_QUALITY:
  case ASTCENC_ERR_BAD_SWIZZLE:
  case ASTCENC_ERR_BAD_FLAGS:
  case ASTCENC_ERR_BAD_DECODE_MODE:
    __assert_fail("false && \"libktx passing bad parameter to astcenc\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x264,"ktx_error_code_e mapAstcError(astcenc_error)");
  case ASTCENC_ERR_BAD_CONTEXT:
    __assert_fail("false && \"libktx has set up astcenc context incorrectly\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x267,"ktx_error_code_e mapAstcError(astcenc_error)");
  case ASTCENC_ERR_NOT_IMPLEMENTED:
    __assert_fail("false && \"ASTCENC_BLOCK_MAX_TEXELS not enough for specified block size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x26e,"ktx_error_code_e mapAstcError(astcenc_error)");
  default:
    __assert_fail("false && \"Unhandled astcenc error\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x274,"ktx_error_code_e mapAstcError(astcenc_error)");
  }
}

Assistant:

static ktx_error_code_e
mapAstcError(astcenc_error astc_error) {
    switch (astc_error) {
    case ASTCENC_SUCCESS:
        return KTX_SUCCESS;
    case ASTCENC_ERR_OUT_OF_MEM:
        return KTX_OUT_OF_MEMORY;
    case ASTCENC_ERR_BAD_BLOCK_SIZE: //[[fallthrough]];
    case ASTCENC_ERR_BAD_DECODE_MODE: //[[fallthrough]];
    case ASTCENC_ERR_BAD_FLAGS: //[[fallthrough]];
    case ASTCENC_ERR_BAD_PARAM: //[[fallthrough]];
    case ASTCENC_ERR_BAD_PROFILE: //[[fallthrough]];
    case ASTCENC_ERR_BAD_QUALITY: //[[fallthrough]];
    case ASTCENC_ERR_BAD_SWIZZLE:
        assert(false && "libktx passing bad parameter to astcenc");
        return KTX_INVALID_VALUE;
    case ASTCENC_ERR_BAD_CONTEXT:
        assert(false && "libktx has set up astcenc context incorrectly");
        return KTX_INVALID_OPERATION;
    case ASTCENC_ERR_BAD_CPU_FLOAT:
        assert(false && "Code compiled such that float operations do not meet codec's assumptions.");
        // Most likely compiled with fast math enabled.
        return KTX_INVALID_OPERATION;
    case ASTCENC_ERR_NOT_IMPLEMENTED:
        assert(false && "ASTCENC_BLOCK_MAX_TEXELS not enough for specified block size");
        return KTX_UNSUPPORTED_FEATURE;
    // gcc fails to detect that the switch handles all astcenc_error
    // enumerators and raises a return-type error, "control reaches end of
    // non-void function", hence this
    default:
        assert(false && "Unhandled astcenc error");
        return KTX_INVALID_OPERATION;
    }
}